

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  element_type *peVar1;
  char *filename;
  ContextInitializer *ctxtinit;
  ContextInitializer local_a8;
  
  filename = IStream::fileName(is);
  local_a8._prov_stream = (IStream *)0x0;
  local_a8._initializer.size = 0x68;
  local_a8._initializer.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_a8._initializer.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_a8._initializer.free_fn = (exr_memory_free_func_t)0x0;
  local_a8._initializer.user_data = (void *)0x0;
  local_a8._initializer.read_fn = (exr_read_func_ptr_t)0x0;
  local_a8._initializer.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_a8._initializer.write_fn = (exr_write_func_ptr_t)0x0;
  local_a8._initializer.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_a8._initializer.max_image_width = 0;
  local_a8._initializer.max_image_height = 0;
  local_a8._initializer.max_tile_width = 0;
  local_a8._initializer.max_tile_height = 0;
  local_a8._initializer.zip_level = -2;
  local_a8._initializer.dwa_quality = -1.0;
  local_a8._initializer.flags = 2;
  local_a8._initializer.pad[0] = '\0';
  local_a8._initializer.pad[1] = '\0';
  local_a8._initializer.pad[2] = '\0';
  local_a8._initializer.pad[3] = '\0';
  local_a8._ctxt_type = TEMP;
  local_a8._108_4_ = 0;
  ctxtinit = ContextInitializer::setInputStream(&local_a8,is);
  DeepScanLineInputFile(this,filename,ctxtinit,numThreads);
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->version = version;
  Header::operator=(&peVar1->header,header);
  ((this->_data).
   super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  header_filled = true;
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const Header&                            header,
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is,
    int                                      version,
    int                                      numThreads)
    : DeepScanLineInputFile (
        is->fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (is),
        numThreads)
{
    // who uses this interface, can we remove it?
    _data->version = version;
    _data->header = header;
    _data->header_filled = true;
}